

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

CallOrCast * __thiscall
soul::PoolAllocator::
allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&,bool>
          (PoolAllocator *this,QualifiedIdentifier *args,CommaSeparatedList *args_1,bool *args_2)

{
  bool bVar1;
  SourceCodeText *pSVar2;
  Scope *pSVar3;
  PoolItem *pPVar4;
  
  pPVar4 = allocateSpaceForObject(this,0x48);
  bVar1 = *args_2;
  *(undefined4 *)&pPVar4->field_0x18 = 0x19;
  pSVar2 = (args->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.
           object;
  pPVar4[1].size = (size_t)pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  pSVar3 = (args->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  pPVar4[1].destructor =
       (DestructorFn *)
       (args->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
  pPVar4[1].item = pSVar3;
  *(undefined4 *)&pPVar4[1].field_0x18 = 0;
  pPVar4[2].size = (size_t)args_1;
  *(bool *)&pPVar4[2].destructor = bVar1;
  pPVar4->item = &PTR__CallOrCast_002cbdb0;
  pPVar4[2].item = args;
  pPVar4->destructor =
       allocate<soul::AST::CallOrCast,_soul::AST::QualifiedIdentifier_&,_soul::AST::CommaSeparatedList_&,_bool>
       ::anon_class_1_0_00000001::__invoke;
  return (CallOrCast *)&pPVar4->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }